

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O2

char * __thiscall
google::protobuf::internal::ExtensionSet::ParseField
          (ExtensionSet *this,uint64 tag,char *ptr,Message *containing_type,
          InternalMetadataWithArena *metadata,ParseContext *ctx)

{
  void *pvVar1;
  bool bVar2;
  char *pcVar3;
  uint32 field;
  UnknownFieldSet *unknown;
  bool was_packed_on_wire;
  ExtensionInfo extension;
  bool local_51;
  ExtensionInfo local_50;
  
  field = (uint32)(tag >> 3);
  bVar2 = FindExtension(this,(uint)tag & 7,field,containing_type,ctx,&local_50,&local_51);
  if (bVar2) {
    pcVar3 = ParseFieldWithExtensionInfo<google::protobuf::internal::InternalMetadataWithArena>
                       (this,field,local_51,&local_50,metadata,ptr,ctx);
  }
  else {
    pvVar1 = (metadata->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_;
    if (((ulong)pvVar1 & 1) == 0) {
      unknown = InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                ::mutable_unknown_fields_slow
                          (&metadata->
                            super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                          );
    }
    else {
      unknown = (UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe);
    }
    pcVar3 = UnknownFieldParse(tag,unknown,ptr,ctx);
  }
  return pcVar3;
}

Assistant:

const char* ExtensionSet::ParseField(
    uint64 tag, const char* ptr, const Message* containing_type,
    internal::InternalMetadataWithArena* metadata,
    internal::ParseContext* ctx) {
  int number = tag >> 3;
  bool was_packed_on_wire;
  ExtensionInfo extension;
  if (!FindExtension(tag & 7, number, containing_type, ctx, &extension,
                     &was_packed_on_wire)) {
    return UnknownFieldParse(tag, metadata->mutable_unknown_fields(), ptr, ctx);
  }
  return ParseFieldWithExtensionInfo(number, was_packed_on_wire, extension,
                                     metadata, ptr, ctx);
}